

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

String * asl::Process::loadedLibPath(String *__return_storage_ptr__,String *lib)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  String *pSVar3;
  anon_union_16_2_78e7fdac_for_String_2 *b;
  undefined8 uVar4;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  void *__src;
  long lVar6;
  long lVar7;
  String line;
  String name2;
  Array<asl::String> parts;
  String name1;
  String local_90;
  String local_78;
  String *local_60;
  undefined1 local_58 [24];
  anon_union_16_2_78e7fdac_for_String_2 local_40;
  
  local_60 = __return_storage_ptr__;
  __stream = fopen("/proc/self/maps","rt");
  if ((__stream == (FILE *)0x0) &&
     (__stream = fopen("/proc/curproc/map","rt"), pSVar3 = local_60, __stream == (FILE *)0x0)) {
    String::String(local_60,"");
  }
  else {
    local_78._size = 0;
    local_78._len = 1;
    local_78.field_2._0_2_ = 0x2f;
    paVar5 = &lib->field_2;
    b = paVar5;
    if (lib->_size != 0) {
      b = (anon_union_16_2_78e7fdac_for_String_2 *)(lib->field_2)._str;
    }
    String::append(&local_78,b->_space,lib->_len);
    String::concat((String *)(local_58 + 0x10),&local_78,".so",3);
    if (local_78._size != 0) {
      free((void *)CONCAT62(local_78.field_2._2_6_,local_78.field_2._0_2_));
    }
    String::String(&local_90,"/lib");
    if (lib->_size != 0) {
      paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(lib->field_2)._str;
    }
    String::append(&local_90,paVar5->_space,lib->_len);
    String::concat(&local_78,&local_90,".so",3);
    if (local_90._size != 0) {
      free(local_90.field_2._str);
    }
    String::alloc(&local_90,1000);
    local_90._len = 1000;
    pcVar2 = local_90.field_2._str + 1000;
    if (local_90._size == 0) {
      pcVar2 = &stack0x00000360;
    }
    *pcVar2 = '\0';
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      while( true ) {
        local_58[8] = '\0';
        uVar4 = &local_90.field_2;
        if (local_90._size != 0) {
          uVar4 = local_90.field_2._str;
        }
        local_58._0_8_ = &local_90;
        pcVar2 = fgets((char *)uVar4,1000,__stream);
        SafeString::~SafeString((SafeString *)local_58);
        if (pcVar2 == (char *)0x0) break;
        String::split((String *)local_58);
        if (0 < *(int *)&((String *)(local_58._0_8_ + -0x18))->field_2) {
          lVar6 = 0;
          lVar7 = 0;
          do {
            uVar4 = &local_40;
            if (local_58._16_4_ != 0) {
              uVar4 = local_40._str;
            }
            iVar1 = String::indexOf((String *)((long)(int *)local_58._0_8_ + lVar6),(char *)uVar4,0)
            ;
            if (-1 < iVar1) {
LAB_00139248:
              fclose(__stream);
              uVar4 = local_58._0_8_;
              pSVar3 = local_60;
              iVar1 = *(int *)((long)(local_58._0_8_ + 4) + lVar6);
              String::alloc(local_60,iVar1);
              pSVar3->_len = iVar1;
              if (pSVar3->_size == 0) {
                paVar5 = &pSVar3->field_2;
              }
              else {
                paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar3->field_2)._str;
              }
              if (*(int *)((long)(int *)uVar4 + lVar6) == 0) {
                __src = (void *)((long)(uVar4 + 8) + lVar6);
              }
              else {
                __src = *(void **)((long)(uVar4 + 8) + lVar6);
              }
              memcpy(paVar5,__src,(long)iVar1 + 1);
              Array<asl::String>::~Array((Array<asl::String> *)local_58);
              pSVar3 = local_60;
              goto LAB_001392ae;
            }
            paVar5 = &local_78.field_2;
            if (local_78._size != 0) {
              paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       CONCAT62(local_78.field_2._2_6_,local_78.field_2._0_2_);
            }
            iVar1 = String::indexOf((String *)((long)(int *)local_58._0_8_ + lVar6),paVar5->_space,0
                                   );
            if (-1 < iVar1) goto LAB_00139248;
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 0x18;
          } while (lVar7 < *(int *)&((String *)(local_58._0_8_ + -0x18))->field_2);
        }
        Array<asl::String>::~Array((Array<asl::String> *)local_58);
        iVar1 = feof(__stream);
        if (iVar1 != 0) break;
      }
    }
    fclose(__stream);
    pSVar3 = local_60;
    String::String(local_60,"");
LAB_001392ae:
    if (local_90._size != 0) {
      free(local_90.field_2._str);
    }
    if (local_78._size != 0) {
      free((void *)CONCAT62(local_78.field_2._2_6_,local_78.field_2._0_2_));
    }
    if (local_58._16_4_ != 0) {
      free(local_40._str);
    }
  }
  return pSVar3;
}

Assistant:

String Process::loadedLibPath(const String& lib)
{
	//TextFile mapfile("/proc/self/maps", File::READ);
	FILE* mapfile = fopen("/proc/self/maps", "rt"); // linux
	if(!mapfile)
		mapfile = fopen("/proc/curproc/map", "rt"); // freebsd
	if(!mapfile)
		return "";
	
	String name1 = '/' + lib + ".so";
	String name2 = "/lib" + lib + ".so";
	String line(1000, 1000);

	while(!feof(mapfile))
	{
		//String line = mapfile.readLine();
		char* s = fgets(SafeString(line), 1000, mapfile);
		if(!s) break;
		Array<String> parts = line.split();
		for(int i=0; i<parts.length(); i++)
		if(parts[i].contains(name1) || parts[i].contains(name2))
		{
			fclose(mapfile);
			return parts[i];
		}
	}
	fclose(mapfile);
	return "";
}